

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void gen_add_insn_after(gen_ctx_t gen_ctx,MIR_insn_t after,MIR_insn_t insn)

{
  int iVar1;
  MIR_insn_t after_00;
  MIR_insn_t local_28;
  MIR_insn_t insn_for_bb;
  MIR_insn_t insn_local;
  MIR_insn_t after_local;
  gen_ctx_t gen_ctx_local;
  
  if ((int)*(undefined8 *)&insn->field_0x18 == 0xb4) {
    __assert_fail("insn->code != MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,699,"void gen_add_insn_after(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
  }
  iVar1 = MIR_any_branch_code_p((MIR_insn_code_t)*(undefined8 *)&after->field_0x18);
  local_28 = after;
  if (iVar1 != 0) {
    local_28 = DLIST_MIR_insn_t_next(after);
  }
  iVar1 = MIR_any_branch_code_p((MIR_insn_code_t)*(undefined8 *)&local_28->field_0x18);
  if (iVar1 == 0) {
    MIR_insert_insn_after(gen_ctx->ctx,gen_ctx->curr_func_item,after,insn);
    after_00 = DLIST_MIR_insn_t_next(insn);
    create_new_bb_insns(gen_ctx,after,after_00,local_28);
    return;
  }
  __assert_fail("!MIR_any_branch_code_p (insn_for_bb->code)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2bd,"void gen_add_insn_after(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
}

Assistant:

static void gen_add_insn_after (gen_ctx_t gen_ctx, MIR_insn_t after, MIR_insn_t insn) {
  MIR_insn_t insn_for_bb = after;

  gen_assert (insn->code != MIR_LABEL);
  if (MIR_any_branch_code_p (insn_for_bb->code)) insn_for_bb = DLIST_NEXT (MIR_insn_t, insn_for_bb);
  gen_assert (!MIR_any_branch_code_p (insn_for_bb->code));
  MIR_insert_insn_after (gen_ctx->ctx, curr_func_item, after, insn);
  create_new_bb_insns (gen_ctx, after, DLIST_NEXT (MIR_insn_t, insn), insn_for_bb);
}